

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_Udev.cpp
# Opt level: O3

void __thiscall axl::sys::lnx::libudev::UdevLib::UdevLib(UdevLib *this)

{
  int iVar1;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_78;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_38;
  
  (this->super_DynamicLib).
  super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>.m_h = (void *)0x0;
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  local_38.m_p = (C *)0x0;
  local_38.m_hdr._0_1_ = 0;
  local_38.m_hdr._1_7_ = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_38,(BufHdr *)0x0);
  local_38.m_p = "libudev.so";
  local_38.m_length._0_1_ = 10;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = true;
  iVar1 = psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_38,1);
  if ((char)iVar1 == '\0') {
    local_58.m_length._0_1_ = 0;
    local_58.m_length._1_7_ = 0;
    local_58.m_isNullTerminated = false;
    local_58.m_p = (C *)0x0;
    local_58.m_hdr._0_1_ = 0;
    local_58.m_hdr._1_7_ = 0;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_58,(BufHdr *)0x0);
    local_58.m_p = "libudev.so.1";
    local_58.m_length._0_1_ = 0xc;
    local_58.m_length._1_7_ = 0;
    local_58.m_isNullTerminated = true;
    iVar1 = psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_58,1);
    if ((char)iVar1 == '\0') {
      local_78.m_length._0_1_ = 0;
      local_78.m_length._1_7_ = 0;
      local_78.m_isNullTerminated = false;
      local_78.m_p = (C *)0x0;
      local_78.m_hdr._0_1_ = 0;
      local_78.m_hdr._1_7_ = 0;
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                (&local_78,(BufHdr *)0x0);
      local_78.m_p = "libudev.so.0";
      local_78.m_length._0_1_ = 0xc;
      local_78.m_length._1_7_ = 0;
      local_78.m_isNullTerminated = true;
      psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_78,1);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_78);
    }
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_58);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_38);
  return;
}

Assistant:

UdevLib() {
		open("libudev.so") ||
		open("libudev.so.1") ||
		open("libudev.so.0");
	}